

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

iterator cs_impl::list_cs_ext::insert(list *lst,iterator *pos,var *val)

{
  const_iterator __position;
  iterator iVar1;
  any local_20;
  any local_18;
  
  __position._M_node = pos->_M_node;
  local_18.mDat = val->mDat;
  if (local_18.mDat != (proxy *)0x0) {
    (local_18.mDat)->refcount = (local_18.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&local_20,(EVP_PKEY_CTX *)&local_18);
  iVar1 = std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace<cs_impl::any>
                    (lst,__position,&local_20);
  any::recycle(&local_20);
  any::recycle(&local_18);
  return (iterator)iVar1._M_node;
}

Assistant:

list::iterator insert(list &lst, list::iterator &pos, const var &val)
		{
			return lst.insert(pos, copy(val));
		}